

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O0

void lws_dll2_remove(lws_dll2 *d)

{
  int iVar1;
  lws_dll2 *d_local;
  
  iVar1 = lws_dll2_is_detached(d);
  if (iVar1 == 0) {
    if (d->next != (lws_dll2 *)0x0) {
      d->next->prev = d->prev;
    }
    if (d->prev != (lws_dll2 *)0x0) {
      d->prev->next = d->next;
    }
    if (d->owner->tail == d) {
      d->owner->tail = d->prev;
    }
    if (d->owner->head == d) {
      d->owner->head = d->next;
    }
    d->owner->count = d->owner->count - 1;
    d->owner = (lws_dll2_owner *)0x0;
    d->prev = (lws_dll2 *)0x0;
    d->next = (lws_dll2 *)0x0;
  }
  return;
}

Assistant:

void
lws_dll2_remove(struct lws_dll2 *d)
{
	if (lws_dll2_is_detached(d))
		return;

	/* if we have a next guy, set his prev to our prev */
	if (d->next)
		d->next->prev = d->prev;

	/* if we have a previous guy, set his next to our next */
	if (d->prev)
		d->prev->next = d->next;

	/* if we have phead, track the tail and head if it points to us... */

	if (d->owner->tail == d)
		d->owner->tail = d->prev;

	if (d->owner->head == d)
		d->owner->head = d->next;

	d->owner->count--;

	/* we're out of the list, we should not point anywhere any more */
	d->owner = NULL;
	d->prev = NULL;
	d->next = NULL;
}